

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

double regularizer_direction_magnitude(vw *all,bfgs *b,float regularizer)

{
  double dVar1;
  
  if ((regularizer == 0.0) && (!NAN(regularizer))) {
    return 0.0;
  }
  if ((all->weights).sparse == true) {
    dVar1 = regularizer_direction_magnitude<sparse_parameters>
                      (all,b,(double)regularizer,&(all->weights).sparse_weights);
    return dVar1;
  }
  dVar1 = regularizer_direction_magnitude<dense_parameters>
                    (all,b,(double)regularizer,&(all->weights).dense_weights);
  return dVar1;
}

Assistant:

double regularizer_direction_magnitude(vw& all, bfgs& b, float regularizer)
{
  // compute direction magnitude
  double ret = 0.;

  if (regularizer == 0.)
    return ret;

  if (all.weights.sparse)
    return regularizer_direction_magnitude(all, b, regularizer, all.weights.sparse_weights);
  else
    return regularizer_direction_magnitude(all, b, regularizer, all.weights.dense_weights);
}